

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_export_strings.hpp
# Opt level: O3

void add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
               (database *db,char **first,char **last,
               insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
               out)

{
  anon_class_24_3_5625b2a5 __unary_op;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  __result;
  mock_mutex mutex;
  vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  views;
  indirect_string_adder adder;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  name_index;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mutex_type local_d9;
  undefined1 local_d8 [8];
  sstring_view<const_char_*> *psStack_d0;
  long local_c8;
  indirect_string_adder local_b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  local_98;
  indirect_string_adder *local_90;
  transaction<std::unique_lock<mock_mutex>_> *ptStack_88;
  index *local_80;
  index local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  transaction<std::unique_lock<mock_mutex>_> local_68;
  
  local_98._M_cur =
       (__node_type *)
       out.iter.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
       ._M_cur;
  local_d8 = (undefined1  [8])&local_d9;
  psStack_d0 = (sstring_view<const_char_*> *)((ulong)psStack_d0 & 0xffffffffffffff00);
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_d8);
  psStack_d0 = (sstring_view<const_char_*> *)CONCAT71(psStack_d0._1_7_,true);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_68,db,(unique_lock<mock_mutex> *)local_d8);
  pstore::index::
  get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            (local_78,db,true);
  local_d8 = (undefined1  [8])0x0;
  psStack_d0 = (sstring_view<const_char_*> *)0x0;
  local_c8 = 0;
  std::
  transform<char_const**,std::back_insert_iterator<std::vector<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>>,add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>(pstore::database&,char_const**,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>)::_lambda(char_const*)_1_>
            (first,last);
  local_90 = &local_b8;
  local_b8.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __unary_op.transaction = &local_68;
  __unary_op.adder = local_90;
  __unary_op.name_index =
       (shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
        *)local_78;
  __result.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
               )local_98._M_cur;
  __result.container = out.container;
  ptStack_88 = &local_68;
  local_80 = local_78;
  std::
  transform<__gnu_cxx::__normal_iterator<pstore::sstring_view<char_const*>*,std::vector<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>>,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>,add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>(pstore::database&,char_const**,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>)::_lambda(pstore::sstring_view<char_const*>const&)_1_>
            ((__normal_iterator<pstore::sstring_view<const_char_*>_*,_std::vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>_>
              )local_d8,
             (__normal_iterator<pstore::sstring_view<const_char_*>_*,_std::vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>_>
              )psStack_d0,__result,__unary_op);
  pstore::indirect_string_adder::flush(&local_b8,&local_68.super_transaction_base);
  pstore::transaction_base::commit(&local_68.super_transaction_base);
  if (local_b8.views_.
      super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.views_.
                    super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.views_.
                          super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.views_.
                          super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8,local_c8 - (long)local_d8);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  local_68.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00234578;
  pstore::transaction_base::rollback(&local_68.super_transaction_base);
  return;
}

Assistant:

void add_export_strings (pstore::database & db, InputIterator first, InputIterator last,
                         OutputIterator out) {
    mock_mutex mutex;
    auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
    auto const name_index = pstore::index::get_index<Index> (db);

    std::vector<pstore::raw_sstring_view> views;
    std::transform (first, last, std::back_inserter (views),
                    [] (pstore::gsl::czstring str) { return pstore::make_sstring_view (str); });

    using string_address = pstore::typed_address<pstore::indirect_string>;
    pstore::indirect_string_adder adder;
    std::transform (std::begin (views), std::end (views), out,
                    [&] (pstore::raw_sstring_view const & view) {
                        std::pair<pstore::index::name_index::iterator, bool> const res1 =
                            adder.add (transaction, name_index, &view);
                        return std::make_pair (view.to_string (),
                                               string_address::make (res1.first.get_address ()));
                    });

    adder.flush (transaction);
    transaction.commit ();
}